

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O2

bool_t prf_init(void)

{
  prf_messages_init();
  prf_messages_add_handler(4,1,profit_error,(void *)0x0);
  pool_system_init();
  prf_nodeinfo_init();
  return 1;
}

Assistant:

bool_t
prf_init(
    void )
{
    assert( prf_endianness_verification() && "invalid endianness setting" );
    prf_messages_init();
#ifndef NDEBUG
    /* configure these for level-of-verboseness during debugging */
    prf_messages_add_handler( PRF_MSG_DEBUG,  3, profit_debug, NULL );
    prf_messages_add_handler( PRF_MSG_WARNING, 3, profit_warning, NULL );
#endif /* ! NDEBUG */
    prf_messages_add_handler( PRF_MSG_ERROR, 1, profit_error, NULL );
    pool_system_init();
    prf_nodeinfo_init();
    return TRUE;
}